

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O1

bool absl::lts_20250127::str_format_internal::ConvertFloatImpl
               (longdouble v,FormatConversionSpecImpl *conv,FormatSinkImpl *sink)

{
  int iVar1;
  string_view data_postfix;
  Decomposed<long_double> decomposed_00;
  Decomposed<long_double> decomposed_01;
  uint3 uVar2;
  uint3 uVar3;
  undefined8 uVar4;
  unkbyte10 Var5;
  bool bVar6;
  int shift;
  uint uVar7;
  char *pcVar8;
  anon_unknown_0 *paVar9;
  char *pcVar10;
  size_t sVar11;
  FormatConversionChar FVar12;
  byte bVar13;
  byte bVar14;
  uint uVar15;
  size_t padding_offset;
  long lVar16;
  char *pcVar17;
  byte bVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  Buffer *pBVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  FormatState *in_R8;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  FormatSinkImpl *in_R9;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  int iVar32;
  anon_unknown_0 *paVar33;
  int iVar34;
  ulong uVar35;
  char *pcVar36;
  FormatSinkImpl *conv_00;
  byte *pbVar37;
  longdouble lVar38;
  longdouble in_ST1;
  string_view value;
  uint128 v_00;
  uint128 v_01;
  uint128 v_02;
  uint128 v_03;
  string_view data;
  uint128 v_04;
  string_view str;
  char digits_buffer [20];
  Decomposed<long_double> decomposed;
  Buffer buffer;
  undefined2 uVar39;
  undefined6 uVar40;
  int local_19c;
  FormatSinkImpl *local_198;
  longdouble local_190;
  longdouble local_184;
  FormatState local_178;
  undefined8 local_158;
  char *pcStack_150;
  uint128 local_138;
  uint local_128;
  undefined4 uStack_124;
  undefined8 uStack_120;
  int local_10c;
  undefined1 local_108 [16];
  size_t local_f8;
  Buffer *pBStack_f0;
  Buffer local_e8;
  
  local_108._0_10_ = v;
  Var5 = local_108._0_10_;
  local_108._8_2_ = (undefined2)((unkuint10)v >> 0x40);
  if ((short)local_108._8_2_ < 0) {
    lVar38 = -v;
    bVar18 = 0x2d;
  }
  else {
    bVar18 = 0x2b;
    lVar38 = v;
    if ((conv->flags_ & kShowPos) == kBasic) {
      bVar18 = (conv->flags_ & kSignCol) << 3;
    }
  }
  if (bVar18 == 0) {
    pBVar22 = &local_e8;
  }
  else {
    pBVar22 = (Buffer *)(local_e8.data + 1);
    local_e8.data[0] = bVar18;
  }
  local_184 = v;
  local_108._0_10_ = Var5;
  if (NAN(lVar38)) {
    FVar12 = conv->conv_;
    pcVar17 = "NAN";
    pcVar8 = "nan";
LAB_0038712d:
    if ((FVar12 & ~x) == F) {
      pcVar8 = pcVar17;
    }
    if (FVar12 == X) {
      pcVar8 = pcVar17;
    }
    pBVar22->data[2] = pcVar8[2];
    *(undefined2 *)pBVar22->data = *(undefined2 *)pcVar8;
    value._M_len = (long)pBVar22 + (3 - (long)&local_e8);
    uVar28 = conv->flags_ & 1;
    in_R9 = (FormatSinkImpl *)(ulong)uVar28;
    in_R8 = (FormatState *)0xffffffff;
    value._M_str = local_e8.data;
    local_190 = lVar38;
    bVar6 = FormatSinkImpl::PutPaddedString(sink,value,conv->width_,-1,SUB41(uVar28,0));
    if (bVar6) {
      return true;
    }
  }
  else if ((longdouble)INFINITY <= lVar38) {
    FVar12 = conv->conv_;
    pcVar17 = "INF";
    pcVar8 = "inf";
    goto LAB_0038712d;
  }
  iVar32 = 6;
  if (-1 < conv->precision_) {
    iVar32 = conv->precision_;
  }
  local_19c = 0;
  local_198 = sink;
  frexpl(&local_10c);
  ldexpl(0x40);
  uVar28 = local_10c - 0x40;
  uint128::uint128(&local_138,in_ST1);
  uVar4 = local_158;
  local_190 = (longdouble)CONCAT28(local_190._8_2_,conv);
  FVar12 = conv->conv_;
  uVar15 = (FVar12 & 0xfffffffe) - 8;
  if (6 < uVar15) {
    return false;
  }
  local_178.precision = (size_t)iVar32;
  pcVar8 = (char *)((long)&switchD_00387205::switchdataD_004b99d4 +
                   (long)(int)(&switchD_00387205::switchdataD_004b99d4)[uVar15]);
  uVar40 = (undefined6)(local_138.hi_ >> 0x10);
  local_178.sign_char = bVar18;
  local_178.conv = conv;
  local_128 = uVar28;
  switch(FVar12 & 0xfffffffe) {
  case 8:
    local_178.sink = local_198;
    if (local_10c < 0x40) {
      if (local_10c < -0x40) {
        v_00.hi_._0_4_ = 0x40 - local_10c;
        v_00.lo_ = local_138.hi_;
        v_00.hi_._4_4_ = 0;
        anon_unknown_0::FormatFNegativeExpSlow
                  ((anon_unknown_0 *)local_138.lo_,v_00,(int)&local_178,in_R8);
        return true;
      }
    }
    else {
      lVar16 = 0x3f;
      if (local_138.hi_ != 0) {
        for (; local_138.hi_ >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      if ((anon_unknown_0 *)local_138.lo_ == (anon_unknown_0 *)0x0) {
        uVar15 = 0x40;
      }
      else {
        lVar20 = 0x3f;
        if ((anon_unknown_0 *)local_138.lo_ != (anon_unknown_0 *)0x0) {
          for (; local_138.lo_ >> lVar20 == 0; lVar20 = lVar20 + -1) {
          }
        }
        uVar15 = (uint)lVar20 ^ 0x3f;
      }
      uVar7 = (uint)lVar16 ^ 0x3f;
      if (local_138.hi_ == 0) {
        uVar7 = uVar15 + 0x40;
      }
      uVar15 = (local_10c - uVar7) + 0x40;
      pcVar8 = (char *)(ulong)uVar15;
      if (0x80 < (int)uVar15) {
        v_04.hi_._0_4_ = uVar28;
        v_04.lo_ = local_138.hi_;
        v_04.hi_._4_4_ = 0;
        anon_unknown_0::FormatFPositiveExpSlow
                  ((anon_unknown_0 *)local_138.lo_,v_04,(int)&local_178,in_R8);
        return true;
      }
    }
    pcVar36 = local_e8.data + 0x2a;
    local_e8.data[0x2a] = '.';
    pcVar17 = local_e8.data + 0x2b;
    if (local_10c < 0x40) {
      uVar28 = 0x40 - local_10c;
      if (local_10c < -0x3f) {
        paVar33 = (anon_unknown_0 *)0x0;
        paVar9 = (anon_unknown_0 *)0x0;
      }
      else {
        pcVar8 = (char *)(ulong)uVar28;
        bVar18 = (byte)uVar28 & 0x3f;
        paVar9 = (anon_unknown_0 *)(local_138.hi_ >> ((byte)uVar28 & 0x3f));
        paVar33 = (anon_unknown_0 *)0x0;
        if ((uVar28 & 0x40) == 0) {
          paVar33 = paVar9;
          paVar9 = (anon_unknown_0 *)(local_138.lo_ >> bVar18 | local_138.hi_ << 0x40 - bVar18);
        }
      }
      v_01.hi_ = (uint64_t)pcVar36;
      v_01.lo_ = (uint64_t)paVar33;
      pcVar8 = anon_unknown_0::PrintIntegralDigitsFromRightFast(paVar9,v_01,pcVar8);
      pcVar8[-1] = '0';
      v_02.hi_ = (uint64_t)pcVar17;
      v_02.lo_ = local_138.hi_;
      pcVar10 = anon_unknown_0::PrintFractionalDigitsFast
                          ((anon_unknown_0 *)local_138.lo_,v_02,(char *)(ulong)uVar28,
                           (int)local_178.precision,(size_t)in_R9);
      pcVar36 = pcVar8 + -1;
      if (pcVar8[-1] == '0') {
        pcVar36 = pcVar8;
      }
    }
    else {
      lVar16 = 0x3f;
      if (local_138.hi_ != 0) {
        for (; local_138.hi_ >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      if ((anon_unknown_0 *)local_138.lo_ == (anon_unknown_0 *)0x0) {
        uVar15 = 0x40;
      }
      else {
        lVar20 = 0x3f;
        if ((anon_unknown_0 *)local_138.lo_ != (anon_unknown_0 *)0x0) {
          for (; local_138.lo_ >> lVar20 == 0; lVar20 = lVar20 + -1) {
          }
        }
        uVar15 = (uint)lVar20 ^ 0x3f;
      }
      uVar7 = (uint)lVar16 ^ 0x3f;
      if (local_138.hi_ == 0) {
        uVar7 = uVar15 + 0x40;
      }
      bVar18 = (byte)uVar28;
      pcVar10 = pcVar17;
      if ((int)((local_10c - uVar7) + 0x40) < 0x41) {
        uVar25 = local_138.lo_ << (bVar18 & 0x3f);
        do {
          pcVar36[-1] = (char)uVar25 + (char)(uVar25 / 10) * -10 | 0x30;
          pcVar36 = pcVar36 + -1;
          bVar6 = 9 < uVar25;
          uVar25 = uVar25 / 10;
        } while (bVar6);
      }
      else {
        paVar33 = (anon_unknown_0 *)(local_138.lo_ << (bVar18 & 0x3f));
        paVar9 = (anon_unknown_0 *)0x0;
        if ((uVar28 & 0x40) == 0) {
          paVar9 = paVar33;
          paVar33 = (anon_unknown_0 *)
                    (local_138.hi_ << (bVar18 & 0x3f) | local_138.lo_ >> 0x40 - (bVar18 & 0x3f));
        }
        v_03.hi_ = (uint64_t)pcVar36;
        v_03.lo_ = (uint64_t)paVar33;
        pcVar36 = anon_unknown_0::PrintIntegralDigitsFromRightFast
                            (paVar9,v_03,(char *)(ulong)uVar28);
      }
    }
    if (local_178.precision == 0) {
      lVar16 = (long)(char)((((local_178.conv)->flags_ >> 3 & 1) != 0) + -1);
    }
    else {
      lVar16 = 0;
    }
    pcVar8 = pcVar10 + (lVar16 - (long)pcVar36);
    pcVar17 = pcVar17 + (local_178.precision - (long)pcVar10);
    local_158 = 0;
    pcStack_150 = "";
    sVar11 = 0;
    uVar39 = 0x762c;
    uVar40 = 0x3c;
    padding_offset = 0;
    goto LAB_003878cb;
  case 10:
    decomposed_01._20_4_ = uStack_124;
    decomposed_01.exponent = uVar28;
    decomposed_01.mantissa.hi_._0_2_ = (short)local_138.hi_;
    decomposed_01.mantissa.lo_ = local_138.lo_;
    decomposed_01.mantissa.hi_._2_6_ = uVar40;
    decomposed_01._24_8_ = uStack_120;
    bVar6 = (anonymous_namespace)::
            FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,long_double>
                      (decomposed_01,local_178.precision,&local_e8,&local_19c);
    if (!bVar6) {
LAB_00387338:
      bVar6 = anon_unknown_0::FallbackToSnprintf<long_double>(local_184,local_190._0_8_,local_198);
      return bVar6;
    }
    conv_00 = local_198;
    pbVar37 = &(local_190._0_8_)->conv_;
    if ((*(byte *)((long)local_190._0_8_ + 1) & 8) == 0) {
      if (local_e8.end <= local_e8.begin) {
LAB_00387972:
        __assert_fail("begin < end",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                      ,0x3fc,
                      "char &absl::str_format_internal::(anonymous namespace)::Buffer::back() const"
                     );
      }
      if (local_e8.end[-1] == '.') {
        local_e8.end = local_e8.end + -1;
      }
    }
    break;
  case 0xc:
    if (iVar32 == 0) {
      local_178.precision = 1;
    }
    decomposed_00._20_4_ = uStack_124;
    decomposed_00.exponent = uVar28;
    decomposed_00.mantissa.hi_._0_2_ = (short)local_138.hi_;
    decomposed_00.mantissa.lo_ = local_138.lo_;
    decomposed_00.mantissa.hi_._2_6_ = uVar40;
    decomposed_00._24_8_ = uStack_120;
    bVar6 = (anonymous_namespace)::
            FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,long_double>
                      (decomposed_00,local_178.precision - 1,&local_e8,&local_19c);
    conv_00 = local_198;
    if (!bVar6) goto LAB_00387338;
    uVar25 = (ulong)local_19c;
    pbVar37 = &(local_190._0_8_)->conv_;
    if ((long)uVar25 < 0) {
      if (-5 < local_19c) goto LAB_00387609;
    }
    else if (uVar25 < local_178.precision) {
LAB_00387609:
      if (local_19c < 0) {
        local_e8.begin[1] = *local_e8.begin;
        if (local_19c != -1) {
          local_19c = local_19c + 1;
          do {
            pcVar8 = local_e8.begin + -1;
            *local_e8.begin = '0';
            local_19c = local_19c + 1;
            local_e8.begin = pcVar8;
          } while (local_19c != 0);
        }
        *local_e8.begin = '.';
        local_e8.begin[-1] = '0';
        local_e8.begin = local_e8.begin + -1;
      }
      else if (local_19c != 0) {
        std::_V2::__rotate<char*>(local_e8.begin + 1,local_e8.begin + 2,local_e8.begin + uVar25 + 2)
        ;
      }
      local_19c = 0;
    }
    pcVar8 = local_e8.end;
    if ((pbVar37[1] & 8) == 0) {
      do {
        local_e8.end = pcVar8;
        if (local_e8.end <= local_e8.begin) goto LAB_00387972;
        pcVar8 = local_e8.end + -1;
      } while (*pcVar8 == '0');
      if (*pcVar8 == '.') {
        local_e8.end = pcVar8;
      }
    }
    if (local_19c == 0) goto LAB_003879d3;
    break;
  case 0xe:
    local_178.sink = local_198;
    iVar1 = conv->precision_;
    local_10c = local_10c + 0x40;
    if (local_138.hi_ != 0 || (anon_unknown_0 *)local_138.lo_ != (anon_unknown_0 *)0x0) {
      iVar34 = -0x3ffe;
      if (local_10c < -0x3ffe) {
        iVar34 = local_10c;
      }
      do {
        if ((long)local_138.hi_ < 0) break;
        if (local_10c < -0x3ffd) {
          bVar18 = 2 - (char)iVar34;
          uVar30 = local_138.hi_ >> (bVar18 & 0x3f);
          uVar19 = 0;
          uVar29 = uVar30;
          uVar25 = local_138.lo_ >> (bVar18 & 0x3f) | local_138.hi_ << 0x40 - (bVar18 & 0x3f);
          if ((bVar18 & 0x40) != 0) {
            uVar29 = 0;
            uVar25 = uVar30;
          }
          iVar34 = -0x3ffe;
          goto LAB_003873e2;
        }
        local_138.hi_ = local_138.hi_ << 1 | local_138.lo_ >> 0x3f;
        local_138.lo_ = local_138.lo_ * 2;
        local_10c = local_10c + -1;
      } while ((anon_unknown_0 *)local_138.lo_ != (anon_unknown_0 *)0x0 || local_138.hi_ != 0);
    }
    uVar19 = local_138.hi_ >> 0x3c;
    iVar34 = 0;
    if ((anon_unknown_0 *)local_138.lo_ != (anon_unknown_0 *)0x0 || local_138.hi_ != 0) {
      iVar34 = local_10c + -4;
    }
    uVar29 = local_138.hi_ << 4 | local_138.lo_ >> 0x3c;
    uVar25 = local_138.lo_ << 4;
LAB_003873e2:
    uVar30 = 0x20 - local_178.precision;
    if (0x20 < local_178.precision) {
      uVar30 = 0;
    }
    uVar31 = 0xffffffffffffffff;
    if (iVar1 < 0) {
      uVar30 = 0;
    }
    uVar35 = uVar29;
    if (uVar30 != 0) {
      local_184 = (longdouble)CONCAT64(local_184._4_6_,iVar34);
      local_198 = (FormatSinkImpl *)CONCAT44(local_198._4_4_,iVar1);
      uVar28 = (int)uVar30 * 4;
      bVar18 = (byte)uVar28;
      bVar13 = 0x80 - bVar18;
      uVar23 = 0xffffffffffffffffU >> (bVar13 & 0x3f) | -1L << 0x40 - (bVar13 & 0x3f);
      uVar21 = 0xffffffffffffffff >> (bVar13 & 0x3f);
      if ((bVar13 & 0x40) != 0) {
        uVar21 = 0;
        uVar23 = 0xffffffffffffffff >> (bVar13 & 0x3f);
      }
      bVar14 = (byte)(uVar28 - 4);
      bVar13 = bVar14 & 0x3f;
      uVar26 = 8L << (bVar14 & 0x3f);
      uVar21 = uVar21 & uVar29;
      uVar27 = uVar26;
      uVar24 = 0L << bVar13 | 8UL >> 0x40 - bVar13;
      if ((uVar28 - 4 & 0x40) != 0) {
        uVar27 = 0;
        uVar24 = uVar26;
      }
      if ((uVar23 & uVar25) == uVar27 && uVar21 == uVar24) {
        bVar13 = (byte)uVar19;
        if (uVar30 != 0x20) {
          uVar24 = 0xfL << (bVar18 & 0x3f);
          uVar21 = uVar24;
          uVar23 = 0L << (bVar18 & 0x3f) | 0xfUL >> 0x40 - (bVar18 & 0x3f);
          if ((uVar28 & 0x40) != 0) {
            uVar21 = 0;
            uVar23 = uVar24;
          }
          bVar13 = (byte)((uVar23 & uVar29) >> (bVar18 & 0x3f));
          if ((uVar28 & 0x40) == 0) {
            bVar13 = (byte)((uVar21 & uVar25) >> (bVar18 & 0x3f)) |
                     (byte)((uVar23 & uVar29) << 0x40 - (bVar18 & 0x3f));
          }
        }
        bVar6 = (bool)(bVar13 & 1);
      }
      else {
        bVar6 = uVar24 < uVar21 || uVar24 - uVar21 < (ulong)(uVar27 < (uVar23 & uVar25));
      }
      if (bVar6 != false) {
        uVar24 = 1L << (bVar18 & 0x3f);
        uVar21 = 0;
        uVar23 = uVar24;
        uVar35 = 0L << (bVar18 & 0x3f) | 1UL >> 0x40 - (bVar18 & 0x3f);
        if ((uVar28 & 0x40) != 0) {
          uVar23 = uVar21;
          uVar35 = uVar24;
        }
        if (0x1f < uVar30) {
          uVar35 = uVar21;
          uVar23 = uVar21;
        }
        bVar6 = CARRY8(uVar25,uVar23);
        uVar25 = uVar25 + uVar23;
        uVar35 = uVar35 + uVar29 + (ulong)bVar6;
        bVar18 = (byte)uVar19 + (-1 < (long)uVar35 && (long)uVar29 < 0 || 0x1f < uVar30);
        uVar19 = (ulong)bVar18;
        if (0xf < bVar18) {
          iVar34 = iVar34 + 4;
          uVar19 = 1;
          uVar25 = 0;
          uVar35 = 0;
        }
      }
    }
    if (-1 < iVar1) {
      if (uVar30 == 0) {
        uVar29 = 0;
      }
      else {
        bVar18 = 0x80 - (char)((int)uVar30 << 2);
        uVar31 = 0xffffffffffffffffU >> (bVar18 & 0x3f) | -1L << 0x40 - (bVar18 & 0x3f);
        uVar29 = 0xffffffffffffffffU >> (bVar18 & 0x3f) | 0L << 0x40 - (bVar18 & 0x3f);
        if ((bVar18 & 0x40) != 0) {
          uVar29 = 0;
          uVar31 = 0xffffffffffffffff >> (bVar18 & 0x3f);
        }
        uVar31 = ~uVar31;
      }
      uVar25 = uVar25 & uVar31;
      uVar35 = uVar35 & ~uVar29;
    }
    lVar16 = (ulong)(FVar12 != A) * 0x10;
    uVar2 = CONCAT12("0123456789ABCDEF0123456789abcdef"[uVar19 + lVar16],
                     CONCAT11((FVar12 != A) << 5,0x30));
    local_158._0_3_ = uVar2 | 0x5800;
    uVar3 = (uint3)local_158;
    local_158 = CONCAT53(local_158._3_5_,uVar2) | 0x5800;
    if ((((iVar1 < 0) || (iVar32 == 0)) && ((-1 < iVar1 || (uVar25 == 0 && uVar35 == 0)))) &&
       ((conv->flags_ & kAlt) == kBasic)) {
      lVar20 = (long)&local_158 + 3;
    }
    else {
      lVar20 = (long)&local_158 + 4;
      local_158._4_4_ = SUB84(uVar4,4);
      local_158._0_4_ = CONCAT13(0x2e,uVar3);
    }
    uVar29 = 0;
    if (uVar25 != 0 || uVar35 != 0) {
      do {
        *(char *)(lVar20 + uVar29) = "0123456789ABCDEF0123456789abcdef"[(uVar35 >> 0x3c) + lVar16];
        uVar35 = uVar35 << 4 | uVar25 >> 0x3c;
        uVar25 = uVar25 << 4;
        uVar29 = uVar29 + 1;
      } while (uVar25 != 0 || uVar35 != 0);
      lVar20 = lVar20 + uVar29;
    }
    if (iVar1 < 0) {
      pcVar17 = (char *)0x0;
    }
    else {
      pcVar17 = (char *)(local_178.precision - uVar29);
      if (local_178.precision < uVar29) {
        __assert_fail("state.precision >= digits_emitted",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                      ,0x3a5,
                      "void absl::str_format_internal::(anonymous namespace)::FormatA(const HexFloatTypeParams, Int, int, bool, const FormatState &) [Int = absl::uint128]"
                     );
      }
    }
    pcVar36 = (char *)&local_158;
    pcVar8 = (char *)(lVar20 - (long)pcVar36);
    local_e8.data[0] = (FVar12 != A) << 5 | 0x50;
    local_e8.data[1] = (char)(iVar34 >> 0x1f) * -2 + '+';
    iVar32 = -iVar34;
    if (0 < iVar34) {
      iVar32 = iVar34;
    }
    numbers_internal::FastIntToBuffer(iVar32,local_e8.data + 2);
    sVar11 = strlen(local_e8.data);
    uVar39 = SUB82(&local_e8,0);
    uVar40 = (undefined6)((ulong)&local_e8 >> 0x10);
    padding_offset = 2;
    local_f8 = sVar11;
    pBStack_f0 = &local_e8;
LAB_003878cb:
    data_postfix._M_str._0_2_ = uVar39;
    data_postfix._M_len = sVar11;
    data_postfix._M_str._2_6_ = uVar40;
    data._M_str = pcVar36;
    data._M_len = (size_t)pcVar8;
    anon_unknown_0::FinalPrint(&local_178,data,padding_offset,(size_t)pcVar17,data_postfix);
    return true;
  }
  bVar13 = 0x45;
  if (*pbVar37 != 7) {
    bVar13 = ((*pbVar37 & 0xf9) != 9) << 5 | 0x45;
  }
  anon_unknown_0::PrintExponent(local_19c,bVar13,&local_e8);
LAB_003879d3:
  str._M_str = (char *)pbVar37;
  str._M_len = (size_t)local_e8.begin;
  anon_unknown_0::WriteBufferToSink
            ((anon_unknown_0 *)(ulong)bVar18,(char)local_e8.end - (char)local_e8.begin,str,
             (FormatConversionSpecImpl *)conv_00,in_R9);
  return true;
}

Assistant:

bool ConvertFloatImpl(long double v, const FormatConversionSpecImpl &conv,
                      FormatSinkImpl *sink) {
  if (IsDoubleDouble()) {
    // This is the `double-double` representation of `long double`. We do not
    // handle it natively. Fallback to snprintf.
    return FallbackToSnprintf(v, conv, sink);
  }

  return FloatToSink(v, conv, sink);
}